

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::GLEngine(GLEngine *this)

{
  undefined8 *in_RDI;
  Engine *in_stack_00000380;
  
  Engine::Engine(in_stack_00000380);
  *in_RDI = &PTR_checkError_00796228;
  in_RDI[0x54] = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                   *)0x3e5f72);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                   *)0x3e5f83);
  return;
}

Assistant:

GLEngine::GLEngine() {}